

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionObjectStore.cpp
# Opt level: O1

bool __thiscall SessionObjectStore::deleteObject(SessionObjectStore *this,SessionObject *object)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  pair<std::_Rb_tree_iterator<SessionObject_*>,_std::_Rb_tree_iterator<SessionObject_*>_> pVar4;
  MutexLocker lock;
  SessionObject *local_30;
  MutexLocker local_28;
  
  local_30 = object;
  MutexLocker::MutexLocker(&local_28,this->storeMutex);
  p_Var1 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var1->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0;
      p_Var3 = (&p_Var3->_M_left)[*(SessionObject **)(p_Var3 + 1) < local_30]) {
    if (*(SessionObject **)(p_Var3 + 1) >= local_30) {
      p_Var2 = p_Var3;
    }
  }
  p_Var3 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var1) &&
     (p_Var3 = p_Var2, local_30 < *(SessionObject **)(p_Var2 + 1))) {
    p_Var3 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 == p_Var1) {
    softHSMLog(3,"deleteObject",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/SessionObjectStore.cpp"
               ,0x88,"Cannot delete non-existent object 0x%08X");
  }
  else {
    SessionObject::invalidate(local_30);
    pVar4 = std::
            _Rb_tree<SessionObject_*,_SessionObject_*,_std::_Identity<SessionObject_*>,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
            ::equal_range(&(this->objects)._M_t,&local_30);
    std::
    _Rb_tree<SessionObject_*,_SessionObject_*,_std::_Identity<SessionObject_*>,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
    ::_M_erase_aux(&(this->objects)._M_t,(_Base_ptr)pVar4.first._M_node,
                   (_Base_ptr)pVar4.second._M_node);
  }
  MutexLocker::~MutexLocker(&local_28);
  return (_Rb_tree_header *)p_Var3 != p_Var1;
}

Assistant:

bool SessionObjectStore::deleteObject(SessionObject* object)
{
	MutexLocker lock(storeMutex);

	if (objects.find(object) == objects.end())
	{
		ERROR_MSG("Cannot delete non-existent object 0x%08X", object);

		return false;
	}

	// Invalidate the object instance
	object->invalidate();

	objects.erase(object);

	return true;
}